

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void store_buffer_16bit_to_32bit_w16_avx2(__m256i *in,int32_t *out,int stride,int out_size)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [32];
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)out_size;
  if (out_size < 1) {
    uVar3 = uVar2;
  }
  pauVar4 = (undefined1 (*) [32])(out + 8);
  for (; uVar3 * 0x20 != uVar2; uVar2 = uVar2 + 0x20) {
    auVar1 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)*in + uVar2));
    pauVar4[-1] = auVar1;
    auVar1 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)*in + uVar2 + 0x10));
    *pauVar4 = auVar1;
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + (ulong)(uint)stride * 4);
  }
  return;
}

Assistant:

static inline void store_buffer_16bit_to_32bit_w16_avx2(const __m256i *const in,
                                                        int32_t *out,
                                                        const int stride,
                                                        const int out_size) {
  for (int i = 0; i < out_size; ++i) {
    _mm256_store_si256((__m256i *)(out),
                       _mm256_cvtepi16_epi32(_mm256_castsi256_si128(in[i])));
    _mm256_store_si256(
        (__m256i *)(out + 8),
        _mm256_cvtepi16_epi32(_mm256_extracti128_si256(in[i], 1)));
    out += stride;
  }
}